

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void Rescale(CPpmd8 *p)

{
  Byte BVar1;
  byte bVar2;
  byte bVar3;
  UInt16 UVar4;
  ushort uVar5;
  CPpmd_State_Ref CVar6;
  CPpmd_State *pCVar7;
  CPpmd8_Context *pCVar8;
  ulong uVar9;
  Byte BVar10;
  UInt16 UVar11;
  Byte BVar12;
  UInt16 UVar13;
  Byte *pBVar14;
  uint uVar15;
  void *pvVar16;
  byte *pbVar17;
  undefined1 uVar18;
  Byte *pBVar19;
  uint uVar20;
  byte bVar21;
  CPpmd_State *oldPtr;
  CPpmd_State *pCVar22;
  uint uVar23;
  uint uVar24;
  CPpmd_State *pCVar25;
  uint uVar26;
  byte bVar27;
  bool bVar28;
  CPpmd_State tmp;
  
  pCVar7 = p->FoundState;
  oldPtr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  UVar4 = pCVar7->SuccessorHigh;
  BVar1 = pCVar7->Symbol;
  BVar12 = pCVar7->Freq;
  UVar13 = pCVar7->SuccessorLow;
  for (; pCVar7 != oldPtr; pCVar7 = pCVar7 + -1) {
    pCVar7->SuccessorHigh = pCVar7[-1].SuccessorHigh;
    BVar10 = pCVar7[-1].Freq;
    UVar11 = pCVar7[-1].SuccessorLow;
    pCVar7->Symbol = pCVar7[-1].Symbol;
    pCVar7->Freq = BVar10;
    pCVar7->SuccessorLow = UVar11;
  }
  pCVar7->SuccessorHigh = UVar4;
  pCVar7->Symbol = BVar1;
  pCVar7->Freq = BVar12;
  pCVar7->SuccessorLow = UVar13;
  pCVar8 = p->MinContext;
  uVar5 = pCVar8->SummFreq;
  bVar27 = pCVar7->Freq;
  bVar21 = bVar27 + 4;
  pCVar7->Freq = bVar21;
  bVar28 = p->OrderFall != 0;
  uVar20 = (uint)bVar21 + (uint)bVar28 >> 1;
  pCVar7->Freq = (Byte)uVar20;
  uVar23 = (uint)pCVar8->NumStats;
  pBVar14 = &pCVar7->Freq;
  uVar26 = (uint)uVar5 - (uint)bVar27;
  do {
    uVar15 = uVar26;
    pBVar19 = pBVar14;
    pCVar22 = pCVar7;
    bVar27 = pCVar22[1].Freq;
    uVar24 = (uint)bVar27 + (uint)bVar28 >> 1;
    bVar21 = (byte)uVar24;
    pCVar22[1].Freq = bVar21;
    if (pCVar22->Freq < uVar24) {
      BVar1 = pCVar22[1].Symbol;
      UVar4 = pCVar22[1].SuccessorLow;
      UVar13 = pCVar22[1].SuccessorHigh;
      pCVar7 = pCVar22;
      do {
        pCVar25 = pCVar7;
        pCVar25[1].SuccessorHigh = pCVar25->SuccessorHigh;
        BVar12 = pCVar25->Freq;
        UVar11 = pCVar25->SuccessorLow;
        pCVar25[1].Symbol = pCVar25->Symbol;
        pCVar25[1].Freq = BVar12;
        pCVar25[1].SuccessorLow = UVar11;
        if (pCVar25 == oldPtr) break;
        pCVar7 = pCVar25 + -1;
      } while (pCVar25[-1].Freq < bVar21);
      pCVar25->Symbol = BVar1;
      pCVar25->Freq = bVar21;
      pCVar25->SuccessorLow = UVar4;
      pCVar25->SuccessorHigh = UVar13;
    }
    uVar26 = uVar15 - bVar27;
    uVar20 = uVar20 + uVar24;
    uVar23 = uVar23 - 1;
    pCVar7 = pCVar22 + 1;
    pBVar14 = pBVar19 + 6;
    if (uVar23 == 0) {
      if (pCVar22[1].Freq == '\0') {
        pCVar8 = p->MinContext;
        bVar21 = pCVar8->NumStats;
        uVar15 = bVar27 - uVar15;
        bVar27 = bVar21;
        do {
          uVar15 = uVar15 - 1;
          bVar27 = bVar27 - 1;
          BVar1 = *pBVar19;
          pBVar19 = pBVar19 + -6;
        } while (BVar1 == '\0');
        uVar26 = -uVar15;
        pCVar8->NumStats = bVar27;
        if (bVar27 == 0) {
          bVar2 = oldPtr->Symbol;
          CVar6 = *(CPpmd_State_Ref *)&oldPtr->SuccessorLow;
          uVar9 = (ulong)(~uVar15 + (uint)oldPtr->Freq * 2) / (ulong)uVar26;
          uVar18 = 0x29;
          if (((uint)uVar9 & 0xfe) < 0x2a) {
            uVar18 = (undefined1)uVar9;
          }
          bVar21 = p->Units2Indx[(bVar21 + 2 >> 1) - 1];
          oldPtr->Symbol = 0xff;
          oldPtr->Freq = 0xff;
          oldPtr->SuccessorLow = 0xffff;
          *(CPpmd_Void_Ref *)&oldPtr->SuccessorHigh = p->FreeList[bVar21];
          bVar3 = p->Indx2Units[bVar21];
          oldPtr[1].SuccessorLow = (short)(uint)bVar3;
          oldPtr[1].SuccessorHigh = (short)((uint)bVar3 >> 0x10);
          p->FreeList[bVar21] = (int)oldPtr - *(int *)&p->Base;
          p->Stamps[bVar21] = p->Stamps[bVar21] + 1;
          pCVar8->Flags = (0x3f < bVar2) << 3 | pCVar8->Flags & 0x10;
          p->FoundState = (CPpmd_State *)&pCVar8->SummFreq;
          *(byte *)&pCVar8->SummFreq = bVar2;
          *(undefined1 *)((long)&pCVar8->SummFreq + 1) = uVar18;
          pCVar8->Stats = CVar6;
        }
        else {
          uVar15 = bVar21 + 2 >> 1;
          uVar23 = bVar27 + 2 >> 1;
          if (uVar15 != uVar23) {
            pvVar16 = ShrinkUnits(p,oldPtr,uVar15,uVar23);
            p->MinContext->Stats = (int)pvVar16 - *(int *)&p->Base;
          }
          pCVar8 = p->MinContext;
          bVar21 = pCVar8->Flags & 0xf7;
          pCVar8->Flags = bVar21;
          pbVar17 = p->Base + pCVar8->Stats;
          bVar21 = (0x3f < *pbVar17) << 3 | bVar21;
          pCVar8->Flags = bVar21;
          uVar23 = (uint)pCVar8->NumStats;
          do {
            pbVar17 = pbVar17 + 6;
            bVar21 = bVar21 | (0x3f < *pbVar17) << 3;
            uVar23 = uVar23 - 1;
          } while (uVar23 != 0);
          pCVar8->Flags = bVar21;
        }
        if (bVar27 == 0) {
          return;
        }
      }
      pCVar8 = p->MinContext;
      pCVar8->SummFreq = ((short)uVar20 + (short)uVar26) - (short)(uVar26 >> 1);
      pCVar8->Flags = pCVar8->Flags | 4;
      p->FoundState = (CPpmd_State *)(p->Base + pCVar8->Stats);
      return;
    }
  } while( true );
}

Assistant:

static void Rescale(CPpmd8 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0
      #ifdef PPMD8_FREEZE_SUPPORT
      || p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE
      #endif
      );
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (Byte)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 0)
    {
      CPpmd_State tmp = *stats;
      tmp.Freq = (Byte)((2 * tmp.Freq + escFreq - 1) / escFreq);
      if (tmp.Freq > MAX_FREQ / 3)
        tmp.Freq = MAX_FREQ / 3;
      InsertNode(p, stats, U2I((numStats + 2) >> 1));
      p->MinContext->Flags = (Byte)((p->MinContext->Flags & 0x10) + 0x08 * (tmp.Symbol >= 0x40));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 2) >> 1;
    n1 = (p->MinContext->NumStats + 2) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
    p->MinContext->Flags &= ~0x08;
    p->MinContext->Flags |= 0x08 * ((s = STATS(p->MinContext))->Symbol >= 0x40);
    i = p->MinContext->NumStats;
    do { p->MinContext->Flags |= 0x08*((++s)->Symbol >= 0x40); } while (--i);
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->MinContext->Flags |= 0x4;
  p->FoundState = STATS(p->MinContext);
}